

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
hta::detail::make_exception<const_char_*,_hta::Clock::time_point>::operator()
          (make_exception<const_char_*,_hta::Clock::time_point> *this,stringstream *msg,char *arg,
          time_point args)

{
  size_t sVar1;
  ostream *poVar2;
  
  poVar2 = (ostream *)(msg + 0x10);
  if (arg == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(arg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,arg,sVar1);
  }
  std::ostream::_M_insert<long>((long)poVar2);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }